

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O3

void ImGui::DebugNodeTable(ImGuiTable *table)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  int iVar6;
  bool bVar7;
  bool bVar8;
  byte bVar9;
  int iVar10;
  uint uVar11;
  char *pcVar12;
  ImVec4 *col;
  ImDrawList *pIVar13;
  long lVar14;
  char *pcVar15;
  ImGuiTableSettings *settings;
  ImGuiTableColumn *p;
  ImGuiTableColumn *pIVar16;
  char *pcVar17;
  ulong uVar18;
  char *pcVar19;
  char *pcVar20;
  float fVar21;
  double dVar22;
  ImRect r;
  char buf [512];
  ImVec2 local_288;
  ImVec2 local_280;
  float local_278;
  uint local_274;
  uint local_270;
  uint local_26c;
  uint local_268;
  uint local_264;
  ImGuiTable *local_260;
  double local_258;
  double local_250;
  char *local_248;
  ImVec2 local_240;
  char local_238 [520];
  
  iVar6 = table->LastFrameActive;
  iVar10 = GetFrameCount();
  pcVar12 = " *Inactive*";
  if (iVar10 + -2 <= iVar6) {
    pcVar12 = "";
  }
  ImFormatString(local_238,0x200,"Table 0x%08X (%d columns, in \'%s\')%s",(ulong)table->ID,
                 (ulong)(uint)table->ColumnsCount,table->OuterWindow->Name,pcVar12);
  if (iVar6 < iVar10 + -2) {
    col = GetStyleColorVec4(1);
    PushStyleColor(0,col);
    bVar7 = TreeNode(table,"%s",local_238);
    PopStyleColor(1);
  }
  else {
    bVar7 = TreeNode(table,"%s",local_238);
  }
  bVar8 = IsItemHovered(0);
  if (bVar8) {
    pIVar13 = GetForegroundDrawList();
    ImDrawList::AddRect(pIVar13,&(table->OuterRect).Min,&(table->OuterRect).Max,0xff00ffff,0.0,0,1.0
                       );
  }
  bVar8 = IsItemVisible();
  if ((bVar8) && (table->HoveredColumnBody != -1)) {
    pIVar13 = GetForegroundDrawList();
    local_288 = GetItemRectMin();
    local_240 = GetItemRectMax();
    ImDrawList::AddRect(pIVar13,&local_288,&local_240,0xff00ffff,0.0,0,1.0);
  }
  if (bVar7 != false) {
    if (0 < table->InstanceCurrent) {
      Text("** %d instances of same table! Some data below will refer to last instance.",
           (ulong)((ushort)table->InstanceCurrent + 1));
    }
    bVar7 = SmallButton("Clear settings");
    fVar21 = (table->OuterRect).Min.x;
    fVar1 = (table->OuterRect).Min.y;
    uVar11 = (table->Flags & 0xe000U) - 0x2000;
    if (uVar11 < 0x8000) {
      pcVar12 = &DAT_001ca3f4 + *(int *)(&DAT_001ca3f4 + (uVar11 >> 0xb));
    }
    else {
      pcVar12 = "N/A";
    }
    BulletText("OuterRect: Pos: (%.1f,%.1f) Size: (%.1f,%.1f) Sizing: \'%s\'",(double)fVar21,
               (double)fVar1,(double)((table->OuterRect).Max.x - fVar21),
               (double)((table->OuterRect).Max.y - fVar1),pcVar12);
    fVar21 = table->InnerWidth;
    pcVar12 = " (auto)";
    if (fVar21 != 0.0) {
      pcVar12 = "";
    }
    if (NAN(fVar21)) {
      pcVar12 = "";
    }
    BulletText("ColumnsGivenWidth: %.1f, ColumnsAutoFitWidth: %.1f, InnerWidth: %.1f%s",
               (double)table->ColumnsGivenWidth,(double)table->ColumnsAutoFitWidth,(double)fVar21,
               pcVar12);
    BulletText("CellPaddingX: %.1f, CellSpacingX: %.1f/%.1f, OuterPaddingX: %.1f",
               (double)table->CellPaddingX,(double)table->CellSpacingX1,(double)table->CellSpacingX2
               ,(double)table->OuterPaddingX);
    BulletText("HoveredColumnBody: %d, HoveredColumnBorder: %d",
               (ulong)(uint)(int)table->HoveredColumnBody,
               (ulong)(uint)(int)table->HoveredColumnBorder);
    BulletText("ResizedColumn: %d, ReorderColumn: %d, HeldHeaderColumn: %d",
               (ulong)(uint)(int)table->ResizedColumn,(ulong)(uint)(int)table->ReorderColumn,
               (ulong)(uint)(int)table->HeldHeaderColumn);
    lVar14 = (long)table->ColumnsCount;
    if (0 < lVar14) {
      pIVar16 = (table->Columns).Data;
      fVar21 = 0.0;
      do {
        if ((table->Columns).DataEnd <= pIVar16) goto LAB_0019b366;
        if ((pIVar16->Flags & 8) != 0) {
          fVar21 = fVar21 + pIVar16->StretchWeight;
        }
        pIVar16 = pIVar16 + 1;
        lVar14 = lVar14 + -1;
      } while (lVar14 != 0);
      local_278 = fVar21;
      if (0 < table->ColumnsCount) {
        lVar14 = 0;
        uVar18 = 0;
        local_260 = table;
        do {
          pIVar16 = (table->Columns).Data;
          if ((table->Columns).DataEnd <= (ImGuiTableColumn *)((long)&pIVar16->Flags + lVar14)) {
LAB_0019b366:
            __assert_fail("p >= Data && p < DataEnd",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O3/_deps/imgui-src/imgui_internal.h"
                          ,0x255,
                          "T &ImSpan<ImGuiTableColumn>::operator[](int) [T = ImGuiTableColumn]");
          }
          local_248 = TableGetColumnName(table,(int)uVar18);
          fVar21 = *(float *)((long)&pIVar16->MinX + lVar14);
          fVar1 = (table->WorkRect).Min.x;
          local_250 = (double)(fVar21 - fVar1);
          fVar2 = *(float *)((long)&pIVar16->MaxX + lVar14);
          local_258 = (double)(fVar2 - fVar1);
          pcVar12 = "";
          if ((long)uVar18 < (long)table->FreezeColumnsRequest) {
            pcVar12 = " (Frozen)";
          }
          fVar1 = *(float *)((long)&pIVar16->StretchWeight + lVar14);
          if (0.0 < fVar1) {
            dVar22 = (double)((fVar1 / local_278) * 100.0);
          }
          else {
            dVar22 = 0.0;
          }
          local_264 = (uint)(&pIVar16->DisplayOrder)[lVar14];
          local_268 = (uint)(&pIVar16->IsEnabled)[lVar14];
          local_26c = (uint)(&pIVar16->IsVisibleX)[lVar14];
          local_270 = (uint)(&pIVar16->IsVisibleY)[lVar14];
          local_274 = (uint)(&pIVar16->IsRequestOutput)[lVar14];
          fVar3 = *(float *)((long)&(pIVar16->ClipRect).Min.x + lVar14);
          fVar4 = *(float *)((long)&(pIVar16->ClipRect).Max.x + lVar14);
          fVar5 = *(float *)((long)&pIVar16->WorkMinX + lVar14);
          bVar9 = (&pIVar16->field_0x65)[lVar14] & 3;
          pcVar20 = "";
          if (bVar9 == 2) {
            pcVar20 = " (Des)";
          }
          if (bVar9 == 1) {
            pcVar20 = " (Asc)";
          }
          uVar11 = *(uint *)((long)&pIVar16->Flags + lVar14);
          pcVar17 = "WidthStretch ";
          if ((uVar11 & 8) == 0) {
            pcVar17 = "";
          }
          pcVar15 = "WidthFixed ";
          if ((uVar11 & 0x10) == 0) {
            pcVar15 = "";
          }
          pcVar19 = "NoResize ";
          if ((uVar11 & 0x20) == 0) {
            pcVar19 = "";
          }
          ImFormatString(local_238,0x200,
                         "Column %d order %d \'%s\': offset %+.2f to %+.2f%s\nEnabled: %d, VisibleX/Y: %d/%d, RequestOutput: %d, SkipItems: %d, DrawChannels: %d,%d\nWidthGiven: %.1f, Request/Auto: %.1f/%.1f, StretchWeight: %.3f (%.1f%%)\nMinX: %.1f, MaxX: %.1f (%+.1f), ClipRect: %.1f to %.1f (+%.1f)\nContentWidth: %.1f,%.1f, HeadersUsed/Ideal %.1f/%.1f\nSort: %d%s, UserID: 0x%08X, Flags: 0x%04X: %s%s%s.."
                         ,local_250,local_258,
                         (double)*(float *)((long)&pIVar16->WidthGiven + lVar14),
                         (double)*(float *)((long)&pIVar16->WidthRequest + lVar14),
                         (double)*(float *)((long)&pIVar16->WidthAuto + lVar14),(double)fVar1,dVar22
                         ,(double)fVar21,uVar18 & 0xffffffff,(ulong)local_264,local_248,pcVar12,
                         local_268,local_26c,local_270,local_274,
                         (uint)(&pIVar16->IsSkipItems)[lVar14],
                         (uint)(&pIVar16->DrawChannelFrozen)[lVar14],
                         (uint)(&pIVar16->DrawChannelUnfrozen)[lVar14],(double)fVar2,
                         (double)(fVar2 - fVar21),(double)fVar3,(double)fVar4,
                         (double)(fVar4 - fVar3),
                         (double)(*(float *)((long)&pIVar16->ContentMaxXFrozen + lVar14) - fVar5),
                         (double)(*(float *)((long)&pIVar16->ContentMaxXUnfrozen + lVar14) - fVar5),
                         (double)(*(float *)((long)&pIVar16->ContentMaxXHeadersUsed + lVar14) -
                                 fVar5),
                         (double)(*(float *)((long)&pIVar16->ContentMaxXHeadersIdeal + lVar14) -
                                 fVar5),(int)(&pIVar16->SortOrder)[lVar14],pcVar20,
                         *(undefined4 *)((long)&pIVar16->UserID + lVar14),uVar11,pcVar17,pcVar15,
                         pcVar19);
          Bullet();
          local_288.x = 0.0;
          local_288.y = 0.0;
          Selectable(local_238,false,0,&local_288);
          bVar8 = IsItemHovered(0);
          table = local_260;
          if (bVar8) {
            local_280.x = *(float *)((long)&pIVar16->MaxX + lVar14);
            local_280.y = (local_260->OuterRect).Max.y;
            local_288.y = (local_260->OuterRect).Min.y;
            local_288.x = *(float *)((long)&pIVar16->MinX + lVar14);
            pIVar13 = GetForegroundDrawList();
            ImDrawList::AddRect(pIVar13,&local_288,&local_280,0xff00ffff,0.0,0,1.0);
          }
          uVar18 = uVar18 + 1;
          lVar14 = lVar14 + 0x68;
        } while ((long)uVar18 < (long)table->ColumnsCount);
      }
    }
    settings = TableGetBoundSettings(table);
    if (settings != (ImGuiTableSettings *)0x0) {
      DebugNodeTableSettings(settings);
    }
    if (bVar7) {
      table->IsResetAllRequest = true;
    }
    TreePop();
  }
  return;
}

Assistant:

void ImGui::DebugNodeTable(ImGuiTable* table)
{
    char buf[512];
    char* p = buf;
    const char* buf_end = buf + IM_ARRAYSIZE(buf);
    const bool is_active = (table->LastFrameActive >= ImGui::GetFrameCount() - 2); // Note that fully clipped early out scrolling tables will appear as inactive here.
    ImFormatString(p, buf_end - p, "Table 0x%08X (%d columns, in '%s')%s", table->ID, table->ColumnsCount, table->OuterWindow->Name, is_active ? "" : " *Inactive*");
    if (!is_active) { PushStyleColor(ImGuiCol_Text, GetStyleColorVec4(ImGuiCol_TextDisabled)); }
    bool open = TreeNode(table, "%s", buf);
    if (!is_active) { PopStyleColor(); }
    if (IsItemHovered())
        GetForegroundDrawList()->AddRect(table->OuterRect.Min, table->OuterRect.Max, IM_COL32(255, 255, 0, 255));
    if (IsItemVisible() && table->HoveredColumnBody != -1)
        GetForegroundDrawList()->AddRect(GetItemRectMin(), GetItemRectMax(), IM_COL32(255, 255, 0, 255));
    if (!open)
        return;
    if (table->InstanceCurrent > 0)
        ImGui::Text("** %d instances of same table! Some data below will refer to last instance.", table->InstanceCurrent + 1);
    bool clear_settings = SmallButton("Clear settings");
    BulletText("OuterRect: Pos: (%.1f,%.1f) Size: (%.1f,%.1f) Sizing: '%s'", table->OuterRect.Min.x, table->OuterRect.Min.y, table->OuterRect.GetWidth(), table->OuterRect.GetHeight(), DebugNodeTableGetSizingPolicyDesc(table->Flags));
    BulletText("ColumnsGivenWidth: %.1f, ColumnsAutoFitWidth: %.1f, InnerWidth: %.1f%s", table->ColumnsGivenWidth, table->ColumnsAutoFitWidth, table->InnerWidth, table->InnerWidth == 0.0f ? " (auto)" : "");
    BulletText("CellPaddingX: %.1f, CellSpacingX: %.1f/%.1f, OuterPaddingX: %.1f", table->CellPaddingX, table->CellSpacingX1, table->CellSpacingX2, table->OuterPaddingX);
    BulletText("HoveredColumnBody: %d, HoveredColumnBorder: %d", table->HoveredColumnBody, table->HoveredColumnBorder);
    BulletText("ResizedColumn: %d, ReorderColumn: %d, HeldHeaderColumn: %d", table->ResizedColumn, table->ReorderColumn, table->HeldHeaderColumn);
    //BulletText("BgDrawChannels: %d/%d", 0, table->BgDrawChannelUnfrozen);
    float sum_weights = 0.0f;
    for (int n = 0; n < table->ColumnsCount; n++)
        if (table->Columns[n].Flags & ImGuiTableColumnFlags_WidthStretch)
            sum_weights += table->Columns[n].StretchWeight;
    for (int n = 0; n < table->ColumnsCount; n++)
    {
        ImGuiTableColumn* column = &table->Columns[n];
        const char* name = TableGetColumnName(table, n);
        ImFormatString(buf, IM_ARRAYSIZE(buf),
            "Column %d order %d '%s': offset %+.2f to %+.2f%s\n"
            "Enabled: %d, VisibleX/Y: %d/%d, RequestOutput: %d, SkipItems: %d, DrawChannels: %d,%d\n"
            "WidthGiven: %.1f, Request/Auto: %.1f/%.1f, StretchWeight: %.3f (%.1f%%)\n"
            "MinX: %.1f, MaxX: %.1f (%+.1f), ClipRect: %.1f to %.1f (+%.1f)\n"
            "ContentWidth: %.1f,%.1f, HeadersUsed/Ideal %.1f/%.1f\n"
            "Sort: %d%s, UserID: 0x%08X, Flags: 0x%04X: %s%s%s..",
            n, column->DisplayOrder, name, column->MinX - table->WorkRect.Min.x, column->MaxX - table->WorkRect.Min.x, (n < table->FreezeColumnsRequest) ? " (Frozen)" : "",
            column->IsEnabled, column->IsVisibleX, column->IsVisibleY, column->IsRequestOutput, column->IsSkipItems, column->DrawChannelFrozen, column->DrawChannelUnfrozen,
            column->WidthGiven, column->WidthRequest, column->WidthAuto, column->StretchWeight, column->StretchWeight > 0.0f ? (column->StretchWeight / sum_weights) * 100.0f : 0.0f,
            column->MinX, column->MaxX, column->MaxX - column->MinX, column->ClipRect.Min.x, column->ClipRect.Max.x, column->ClipRect.Max.x - column->ClipRect.Min.x,
            column->ContentMaxXFrozen - column->WorkMinX, column->ContentMaxXUnfrozen - column->WorkMinX, column->ContentMaxXHeadersUsed - column->WorkMinX, column->ContentMaxXHeadersIdeal - column->WorkMinX,
            column->SortOrder, (column->SortDirection == ImGuiSortDirection_Ascending) ? " (Asc)" : (column->SortDirection == ImGuiSortDirection_Descending) ? " (Des)" : "", column->UserID, column->Flags,
            (column->Flags & ImGuiTableColumnFlags_WidthStretch) ? "WidthStretch " : "",
            (column->Flags & ImGuiTableColumnFlags_WidthFixed) ? "WidthFixed " : "",
            (column->Flags & ImGuiTableColumnFlags_NoResize) ? "NoResize " : "");
        Bullet();
        Selectable(buf);
        if (IsItemHovered())
        {
            ImRect r(column->MinX, table->OuterRect.Min.y, column->MaxX, table->OuterRect.Max.y);
            GetForegroundDrawList()->AddRect(r.Min, r.Max, IM_COL32(255, 255, 0, 255));
        }
    }
    if (ImGuiTableSettings* settings = TableGetBoundSettings(table))
        DebugNodeTableSettings(settings);
    if (clear_settings)
        table->IsResetAllRequest = true;
    TreePop();
}